

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall
Js::ScriptContext::AddToEvalMapHelper
          (ScriptContext *this,FastEvalMapString *key,BOOL isIndirect,ScriptFunction *pFuncScript)

{
  code *pcVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  charcount_t cVar4;
  charcount_t cVar5;
  Recycler *pRVar6;
  Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>
  *this_00;
  TwoLevelHashDictionary<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>,_JsUtil::Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>,_Js::EvalMapStringInternal<false>_>
  *this_01;
  JavascriptString *this_02;
  undefined4 *puVar7;
  type_info *ptVar8;
  Type *addr;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  this_01 = (&(((this->super_ScriptContextBase).javascriptLibrary)->cache).evalCacheDictionary)
            [isIndirect != 0].ptr;
  if (this_01 ==
      (TwoLevelHashDictionary<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>,_JsUtil::Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>,_Js::EvalMapStringInternal<false>_>
       *)0x0) {
    local_68 = (undefined1  [8])
               &JsUtil::
                Cache<Js::EvalMapStringInternal<true>,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,15,Memory::Recycler>,Js::FastEvalMapStringComparer,JsUtil::SimpleDictionaryEntry>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2d86450;
    data.filename._0_4_ = 0xb68;
    data._32_8_ = pFuncScript;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
    this_00 = (Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>
               *)new<Memory::Recycler>(0x10,pRVar6,0x38bbb2);
    JsUtil::
    Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>
    ::Cache(this_00,this->recycler,0);
    local_68 = (undefined1  [8])
               &TwoLevelHashDictionary<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>,JsUtil::Cache<Js::EvalMapStringInternal<true>,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,15,Memory::Recycler>,Js::FastEvalMapStringComparer,JsUtil::SimpleDictionaryEntry>,Js::EvalMapStringInternal<false>>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2d86450;
    data.filename._0_4_ = 0xb69;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
    this_01 = (TwoLevelHashDictionary<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>,_JsUtil::Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>,_Js::EvalMapStringInternal<false>_>
               *)new<Memory::Recycler>(0x10,pRVar6,0x38bbb2);
    pRVar6 = this->recycler;
    Memory::Recycler::WBSetBit((char *)this_01);
    (this_01->dictionary).ptr = this_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this_01);
    this_01->recycler = pRVar6;
    addr = &(((this->super_ScriptContextBase).javascriptLibrary)->cache).evalCacheDictionary +
           (isIndirect != 0);
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = this_01;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pFuncScript = (ScriptFunction *)data._32_8_;
  }
  if (key->owningVar == (FinalizableObject *)0x0) {
    data._32_8_ = pFuncScript;
    this_02 = JavascriptString::NewCopyBuffer((key->str).string.ptr,(key->str).len,this);
    key->owningVar = (FinalizableObject *)this_02;
    cVar5 = (key->str).len;
    cVar4 = JavascriptString::GetLength(this_02);
    if (cVar5 != cVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0xb79,"(key.str.GetLength() == copiedString->GetLength())",
                                  "key.str.GetLength() == copiedString->GetLength()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    ptVar8 = (type_info *)JavascriptString::GetString(this_02);
    cVar5 = JavascriptString::GetLength(this_02);
    Memory::Recycler::WBSetBit(local_68);
    local_68 = (undefined1  [8])ptVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(local_68);
    auVar2 = local_68;
    data.typeinfo = (type_info *)CONCAT44(data.typeinfo._4_4_,cVar5);
    Memory::Recycler::WBSetBit((char *)&key->str);
    (key->str).string.ptr = (char16_t *)auVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&key->str);
    (key->str).len = (Type)data.typeinfo;
    pFuncScript = (ScriptFunction *)data._32_8_;
  }
  TwoLevelHashDictionary<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>,_JsUtil::Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>,_Js::EvalMapStringInternal<false>_>
  ::Add(this_01,key,pFuncScript);
  return;
}

Assistant:

void ScriptContext::AddToEvalMapHelper(FastEvalMapString & key, BOOL isIndirect, ScriptFunction *pFuncScript)
    {
        EvalCacheDictionary *dict = isIndirect ? this->Cache()->indirectEvalCacheDictionary : this->Cache()->evalCacheDictionary;
        if (dict == nullptr)
        {
            EvalCacheTopLevelDictionary* evalTopDictionary = RecyclerNew(this->recycler, EvalCacheTopLevelDictionary, this->recycler);
            dict = RecyclerNew(this->recycler, EvalCacheDictionary, evalTopDictionary, recycler);
            if (isIndirect)
            {
                this->Cache()->indirectEvalCacheDictionary = dict;
            }
            else
            {
                this->Cache()->evalCacheDictionary = dict;
            }
        }

        if (key.owningVar == nullptr)
        {
            // We need to copy buffer because in this case the buffer could have come from the host e.g. through IActiveScriptDirect::Parse
            JavascriptString* copiedString = JavascriptString::NewCopyBuffer(key.str.GetBuffer(), key.str.GetLength(), this);
            key.owningVar = copiedString;
            Assert(key.str.GetLength() == copiedString->GetLength());
            key.str = JsUtil::CharacterBuffer<char16>(copiedString->GetString(), copiedString->GetLength());
        }

        dict->Add(key, pFuncScript);
    }